

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O1

mpt_value_store * rd_values(mpt_rawdata *ptr,uint dim,int nc)

{
  _mpt_vptr_rawdata *p_Var1;
  mpt_value_store *pmVar2;
  
  p_Var1 = ptr[2]._vptr;
  if (p_Var1 != (_mpt_vptr_rawdata *)0x0) {
    if (nc < 0) {
      nc = *(int *)&ptr[3]._vptr;
    }
    if (nc < (int)((ulong)p_Var1->dimension_count >> 4)) {
      pmVar2 = mpt_stage_data((mpt_rawdata_stage *)(&p_Var1->stage_count + (long)nc * 2),dim);
      return pmVar2;
    }
  }
  return (mpt_value_store *)0x0;
}

Assistant:

static const MPT_STRUCT(value_store) *rd_values(const MPT_INTERFACE(rawdata) *ptr, unsigned dim, int nc)
{
	const MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, ptr, _rd);
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(rawdata_stage) *st;
	
	/* query type of raw data */
	if (!(buf = rd->st._buf)) {
		return 0;
	}
	if (nc < 0) {
		nc = rd->act;
	}
	/* cycle does not exist */
	if (nc >= (int) (buf->_used / sizeof(*st))) {
		return 0;
	}
	/* get existing cycle dimension data */
	st = (void *) (buf + 1);
	return mpt_stage_data(st + nc, dim);
}